

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QDataStream * operator>>(QDataStream *in,QTime *time)

{
  uint uVar1;
  long in_FS_OFFSET;
  quint32 ds;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0xaaaaaaaa;
  QDataStream::operator>>(in,(qint32 *)&local_24);
  uVar1 = -(uint)(local_24 == 0) | local_24;
  if (6 < in->ver) {
    uVar1 = local_24;
  }
  time->mds = uVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &in, QTime &time)
{
    quint32 ds;
    in >> ds;
    if (in.version() >= QDataStream::Qt_4_0) {
        time.mds = int(ds);
    } else {
        // Qt3 would write 0 for a null time
        time.mds = (ds == 0) ? QTime::NullTime : int(ds);
    }
    return in;
}